

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GetProcAddressExtensionCase::executeTest(GetProcAddressExtensionCase *this)

{
  CallLogWrapper *this_00;
  TestLog *pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  int iVar3;
  deUint32 err;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  __eglMustCastToProperFunctionPointerType p_Var5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long local_1c8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  pTVar1 = ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  pbVar2 = (this->super_GetProcAddressCase).m_supported.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->super_GetProcAddressCase).m_supported.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,pbVar2,&this->m_extName);
  lVar9 = 0x10;
  do {
    iVar3 = std::__cxx11::string::compare((char *)&this->m_extName);
    if (iVar3 == 0) {
      uVar8 = *(uint *)(&UNK_021122f8 + lVar9);
      local_1c8 = *(long *)((long)&egl::(anonymous_namespace)::s_extensions + lVar9);
      goto LAB_00e582df;
    }
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0xee0);
  local_1c8 = 0;
  uVar8 = 0;
LAB_00e582df:
  local_1b0 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,(this->m_extName)._M_dataplus._M_p,
             (this->m_extName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,": ",2);
  pcVar7 = "not supported";
  if (_Var4._M_current != pbVar2) {
    pcVar7 = "supported";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar7,(ulong)(_Var4._M_current == pbVar2) * 4 + 9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if (0 < (int)uVar8) {
    this_00 = &(this->super_GetProcAddressCase).super_CallLogWrapper;
    uVar10 = 0;
    do {
      pcVar7 = *(char **)(local_1c8 + uVar10 * 8);
      p_Var5 = eglu::CallLogWrapper::eglGetProcAddress(this_00,pcVar7);
      err = eglu::CallLogWrapper::eglGetError(this_00);
      eglu::checkError(err,"eglGetProcAddress()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetProcAddressTests.cpp"
                       ,0xcc);
      if ((_Var4._M_current != pbVar2) && (p_Var5 == (__eglMustCastToProperFunctionPointerType)0x0))
      {
        local_1b0 = (undefined1  [8])pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Fail, received null pointer for supported extension function: ",0x3e);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
        }
        else {
          sVar6 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar7,sVar6);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        tcu::TestContext::setTestResult
                  ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Unexpected null pointer");
      }
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  return;
}

Assistant:

void executeTest (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		bool					supported	= isSupported(m_extName);
		const FunctionNames		funcNames	= getExtFunctionNames(m_extName);

		DE_ASSERT(funcNames.numFunctions > 0);

		log << TestLog::Message << m_extName << ": " << (supported ? "supported" : "not supported") << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;

		for (int funcNdx = 0; funcNdx < funcNames.numFunctions; funcNdx++)
		{
			const char*	funcName		= funcNames.functions[funcNdx];
			void		(*funcPtr)(void);

			funcPtr = eglGetProcAddress(funcName);
			eglu::checkError(eglGetError(), "eglGetProcAddress()", __FILE__, __LINE__);

			if (supported && funcPtr == 0)
			{
				log << TestLog::Message << "Fail, received null pointer for supported extension function: " << funcName << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected null pointer");
			}
		}
	}